

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

MIR_op_t * MIR_new_str_op(MIR_op_t *__return_storage_ptr__,MIR_context_t ctx,MIR_str_t str)

{
  MIR_str_t str_00;
  MIR_op_t *op;
  string local_38;
  MIR_context_t local_20;
  MIR_context_t ctx_local;
  MIR_str_t str_local;
  
  str_local.len = (size_t)str.s;
  ctx_local = (MIR_context_t)str.len;
  local_20 = ctx;
  init_op(__return_storage_ptr__,MIR_OP_STR);
  str_00.s = (char *)str_local.len;
  str_00.len = (size_t)ctx_local;
  get_ctx_string(&local_38,local_20,str_00);
  (__return_storage_ptr__->u).i = local_38.str.len;
  (__return_storage_ptr__->u).str.s = local_38.str.s;
  return __return_storage_ptr__;
}

Assistant:

MIR_op_t MIR_new_str_op (MIR_context_t ctx, MIR_str_t str) {
  MIR_op_t op;

  init_op (&op, MIR_OP_STR);
  op.u.str = get_ctx_string (ctx, str).str;
  return op;
}